

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::replace(QString *this,qsizetype pos,qsizetype len,QChar after)

{
  QString *pQVar1;
  undefined2 in_CX;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  QString *in_stack_00000008;
  undefined6 in_stack_fffffffffffffff0;
  qsizetype len_00;
  
  len_00 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  pQVar1 = replace(in_stack_00000008,unaff_retaddr,len_00,
                   (QChar *)CONCAT26(in_CX,in_stack_fffffffffffffff0),in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == len_00) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, QChar after)
{
    return replace(pos, len, &after, 1);
}